

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * ptls_server_new(ptls_context_t *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ptls_t *tls_00;
  ptls_log_conn_state_t *conn;
  int local_34;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  uint32_t active;
  ptls_t *tls;
  ptls_context_t *ctx_local;
  
  tls_00 = new_instance(ctx,1);
  tls_00->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (tls_00->field_19).server.early_data_skipped_bytes = 0xffffffff;
  uVar1 = ptls_log_point_maybe_active(&ptls_server_new::logpoint);
  if (uVar1 != 0) {
    conn = ptls_get_log_state(tls_00);
    uVar2 = ptls_log_conn_maybe_active(conn,ptls_get_server_name,tls_00);
    if ((uVar2 & uVar1) != 0) {
      local_34 = 0;
      do {
        ptls_log__do_write_start(&ptls_server_new::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls_00);
        ptls_log__do_push_element_bool(",\"is_server\":",0xd,1);
        local_34 = ptls_log__do_write_end
                             (&ptls_server_new::logpoint,conn,ptls_get_server_name,tls_00,local_34);
      } while (local_34 != 0);
    }
  }
  return tls_00;
}

Assistant:

ptls_t *ptls_server_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 1);
    tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    tls->server.early_data_skipped_bytes = UINT32_MAX;

    PTLS_PROBE(NEW, tls, 1);
    PTLS_LOG_CONN(new, tls, { PTLS_LOG_ELEMENT_BOOL(is_server, 1); });
    return tls;
}